

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend,int bIntToNull)

{
  sqlite3 *db;
  int iVar1;
  Expr *pEVar2;
  ExprList_item *pEVar3;
  Expr *p;
  long lVar4;
  long in_FS_OFFSET;
  int iDummy;
  long local_58;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = (long)pList->nExpr;
    }
    if (0 < pAppend->nExpr) {
      lVar4 = 0;
      do {
        db = pParse->db;
        pEVar2 = pAppend->a[lVar4].pExpr;
        if (pEVar2 == (Expr *)0x0) {
          if (db->mallocFailed != '\0') break;
          if (bIntToNull == 0) {
            pEVar2 = (Expr *)0x0;
          }
          else {
LAB_00190f86:
            pEVar2 = (Expr *)0x0;
LAB_00190f89:
            p = (Expr *)0x0;
LAB_00190f8c:
            local_3c = -0x55555556;
            iVar1 = sqlite3ExprIsInteger(p,&local_3c,(Parse *)0x0);
            if (iVar1 != 0) {
              p->op = 'z';
              p->flags = p->flags & 0xcffff7ff;
              (p->u).zToken = (char *)0x0;
            }
          }
        }
        else {
          pEVar2 = exprDup(db,pEVar2,0,(EdupBuf *)0x0);
          if (db->mallocFailed != '\0') {
            if (pEVar2 != (Expr *)0x0) {
              sqlite3ExprDeleteNN(db,pEVar2);
            }
            break;
          }
          if (bIntToNull != 0) {
            p = pEVar2;
            if (pEVar2 == (Expr *)0x0) goto LAB_00190f86;
            do {
              if ((p->flags & 0x82000) == 0) goto LAB_00190f8c;
              if ((p->flags >> 0x13 & 1) == 0) {
                if (p->op != 'r') goto LAB_00190f8c;
                pEVar3 = (ExprList_item *)&p->pLeft;
              }
              else {
                pEVar3 = ((p->x).pList)->a;
              }
              p = pEVar3->pExpr;
            } while (pEVar3->pExpr != (Expr *)0x0);
            goto LAB_00190f89;
          }
        }
        pList = sqlite3ExprListAppend(pParse,pList,pEVar2);
        if (pList != (ExprList *)0x0) {
          pList->a[local_58 + lVar4].fg.sortFlags = pAppend->a[lVar4].fg.sortFlags;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pAppend->nExpr);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pList;
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend,      /* List of values to append. Might be NULL */
  int bIntToNull
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      sqlite3 *db = pParse->db;
      Expr *pDup = sqlite3ExprDup(db, pAppend->a[i].pExpr, 0);
      if( db->mallocFailed ){
        sqlite3ExprDelete(db, pDup);
        break;
      }
      if( bIntToNull ){
        int iDummy;
        Expr *pSub;
        pSub = sqlite3ExprSkipCollateAndLikely(pDup);
        if( sqlite3ExprIsInteger(pSub, &iDummy, 0) ){
          pSub->op = TK_NULL;
          pSub->flags &= ~(EP_IntValue|EP_IsTrue|EP_IsFalse);
          pSub->u.zToken = 0;
        }
      }
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].fg.sortFlags = pAppend->a[i].fg.sortFlags;
    }
  }
  return pList;
}